

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O3

int db_getlocal(lua_State *L)

{
  int iVar1;
  lua_State *L_00;
  lua_Integer lVar2;
  char *pcVar3;
  lua_Integer lVar4;
  int idx;
  int arg;
  lua_Debug ar;
  int local_ac;
  lua_Debug local_a8;
  
  L_00 = getthread(L,&local_ac);
  lVar2 = luaL_checkinteger(L,local_ac + 2);
  idx = local_ac + 1;
  iVar1 = lua_type(L,idx);
  if (iVar1 == 6) {
    lua_pushvalue(L,idx);
    pcVar3 = lua_getlocal(L,(lua_Debug *)0x0,(int)lVar2);
    lua_pushstring(L,pcVar3);
    iVar1 = 1;
  }
  else {
    lVar4 = luaL_checkinteger(L,idx);
    iVar1 = lua_getstack(L_00,(int)lVar4,&local_a8);
    if (iVar1 == 0) {
      iVar1 = luaL_argerror(L,idx,"level out of range");
    }
    else {
      iVar1 = 1;
      checkstack(L,L_00,1);
      pcVar3 = lua_getlocal(L_00,&local_a8,(int)lVar2);
      if (pcVar3 == (char *)0x0) {
        lua_pushnil(L);
      }
      else {
        lua_xmove(L_00,L,1);
        lua_pushstring(L,pcVar3);
        lua_rotate(L,-2,1);
        iVar1 = 2;
      }
    }
  }
  return iVar1;
}

Assistant:

static int db_getlocal (lua_State *L) {
  int arg;
  lua_State *L1 = getthread(L, &arg);
  lua_Debug ar;
  const char *name;
  int nvar = (int)luaL_checkinteger(L, arg + 2);  /* local-variable index */
  if (lua_isfunction(L, arg + 1)) {  /* function argument? */
    lua_pushvalue(L, arg + 1);  /* push function */
    lua_pushstring(L, lua_getlocal(L, NULL, nvar));  /* push local name */
    return 1;  /* return only name (there is no value) */
  }
  else {  /* stack-level argument */
    int level = (int)luaL_checkinteger(L, arg + 1);
    if (!lua_getstack(L1, level, &ar))  /* out of range? */
      return luaL_argerror(L, arg+1, "level out of range");
    checkstack(L, L1, 1);
    name = lua_getlocal(L1, &ar, nvar);
    if (name) {
      lua_xmove(L1, L, 1);  /* move local value */
      lua_pushstring(L, name);  /* push name */
      lua_rotate(L, -2, 1);  /* re-order */
      return 2;
    }
    else {
      lua_pushnil(L);  /* no name (nor value) */
      return 1;
    }
  }
}